

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

TimeZoneRule * __thiscall
icu_63::RuleBasedTimeZone::findRuleInFinal
          (RuleBasedTimeZone *this,UDate date,UBool local,int32_t NonExistingTimeOpt,
          int32_t DuplicatedTimeOpt)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  RuleBasedTimeZone *this_00;
  RuleBasedTimeZone *this_01;
  RuleBasedTimeZone *pRVar9;
  UDate UVar10;
  UDate start1;
  UDate start0;
  UDate local_50;
  double local_40;
  double local_38;
  
  if (this->fFinalRules == (UVector *)0x0) {
    pRVar9 = (RuleBasedTimeZone *)0x0;
  }
  else {
    this_00 = (RuleBasedTimeZone *)UVector::elementAt(this->fFinalRules,0);
    this_01 = (RuleBasedTimeZone *)UVector::elementAt(this->fFinalRules,1);
    pRVar9 = (RuleBasedTimeZone *)0x0;
    if (this_01 != (RuleBasedTimeZone *)0x0 && this_00 != (RuleBasedTimeZone *)0x0) {
      UVar10 = date;
      if (local != '\0') {
        iVar1 = TimeZoneRule::getRawOffset((TimeZoneRule *)this_01);
        iVar2 = TimeZoneRule::getDSTSavings((TimeZoneRule *)this_01);
        iVar3 = TimeZoneRule::getRawOffset((TimeZoneRule *)this_00);
        pRVar9 = this_00;
        iVar4 = TimeZoneRule::getDSTSavings((TimeZoneRule *)this_00);
        iVar1 = getLocalDelta(pRVar9,iVar1,iVar2,iVar3,iVar4,NonExistingTimeOpt,DuplicatedTimeOpt);
        UVar10 = date - (double)iVar1;
      }
      uVar5 = TimeZoneRule::getRawOffset((TimeZoneRule *)this_01);
      uVar6 = TimeZoneRule::getDSTSavings((TimeZoneRule *)this_01);
      iVar7 = (*(this_00->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[10])
                        (UVar10,this_00,(ulong)uVar5,(ulong)uVar6,1,&local_38);
      local_50 = date;
      if (local != '\0') {
        iVar1 = TimeZoneRule::getRawOffset((TimeZoneRule *)this_00);
        iVar2 = TimeZoneRule::getDSTSavings((TimeZoneRule *)this_00);
        iVar3 = TimeZoneRule::getRawOffset((TimeZoneRule *)this_01);
        pRVar9 = this_01;
        iVar4 = TimeZoneRule::getDSTSavings((TimeZoneRule *)this_01);
        iVar1 = getLocalDelta(pRVar9,iVar1,iVar2,iVar3,iVar4,NonExistingTimeOpt,DuplicatedTimeOpt);
        local_50 = date - (double)iVar1;
      }
      uVar5 = TimeZoneRule::getRawOffset((TimeZoneRule *)this_00);
      uVar6 = TimeZoneRule::getDSTSavings((TimeZoneRule *)this_00);
      iVar8 = (*(this_01->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[10])
                        (local_50,this_01,(ulong)uVar5,(ulong)uVar6,1,&local_40);
      if (((char)iVar7 == '\0') || ((char)iVar8 == '\0')) {
        pRVar9 = (RuleBasedTimeZone *)0x0;
        if ((char)iVar8 != '\0') {
          pRVar9 = this_01;
        }
        if ((char)iVar7 != '\0') {
          pRVar9 = this_00;
        }
      }
      else {
        pRVar9 = this_01;
        if (local_40 < local_38) {
          pRVar9 = this_00;
        }
      }
    }
  }
  return (TimeZoneRule *)pRVar9;
}

Assistant:

TimeZoneRule*
RuleBasedTimeZone::findRuleInFinal(UDate date, UBool local,
                                   int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt) const {
    if (fFinalRules == NULL) {
        return NULL;
    }

    AnnualTimeZoneRule* fr0 = (AnnualTimeZoneRule*)fFinalRules->elementAt(0);
    AnnualTimeZoneRule* fr1 = (AnnualTimeZoneRule*)fFinalRules->elementAt(1);
    if (fr0 == NULL || fr1 == NULL) {
        return NULL;
    }

    UDate start0, start1;
    UDate base;
    int32_t localDelta;

    base = date;
    if (local) {
        localDelta = getLocalDelta(fr1->getRawOffset(), fr1->getDSTSavings(),
                                   fr0->getRawOffset(), fr0->getDSTSavings(),
                                   NonExistingTimeOpt, DuplicatedTimeOpt);
        base -= localDelta;
    }
    UBool avail0 = fr0->getPreviousStart(base, fr1->getRawOffset(), fr1->getDSTSavings(), TRUE, start0);

    base = date;
    if (local) {
        localDelta = getLocalDelta(fr0->getRawOffset(), fr0->getDSTSavings(),
                                   fr1->getRawOffset(), fr1->getDSTSavings(),
                                   NonExistingTimeOpt, DuplicatedTimeOpt);
        base -= localDelta;
    }
    UBool avail1 = fr1->getPreviousStart(base, fr0->getRawOffset(), fr0->getDSTSavings(), TRUE, start1);

    if (!avail0 || !avail1) {
        if (avail0) {
            return fr0;
        } else if (avail1) {
            return fr1;
        }
        // Both rules take effect after the given time
        return NULL;
    }

    return (start0 > start1) ? fr0 : fr1;
}